

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:181:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:181:3)>
            *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:181:3)>_2
  aVar1;
  
  if ((this->maybeFunc).ptr.isSet != true) {
    return;
  }
  aVar1 = (this->maybeFunc).ptr.field_1;
  (this->maybeFunc).ptr.isSet = false;
  if (*(long *)((long)aVar1 + 8) != 0) {
    unlink(*(char **)aVar1);
    return;
  }
  unlink("");
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }